

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_whitelist_signature_serialize
              (secp256k1_context *ctx,uchar *output,size_t *output_len,
              secp256k1_whitelist_signature *sig)

{
  void *pvVar1;
  char *pcVar2;
  
  if (output == (uchar *)0x0) {
    pvVar1 = (ctx->illegal_callback).data;
    pcVar2 = "output != NULL";
  }
  else if (output_len == (size_t *)0x0) {
    pvVar1 = (ctx->illegal_callback).data;
    pcVar2 = "output_len != NULL";
  }
  else {
    if (sig != (secp256k1_whitelist_signature *)0x0) {
      if (*output_len < sig->n_keys * 0x20 + 0x21) {
        return 0;
      }
      *output = (uchar)sig->n_keys;
      memcpy(output + 1,sig->data,sig->n_keys * 0x20 + 0x20);
      *output_len = sig->n_keys * 0x20 + 0x21;
      return 1;
    }
    pvVar1 = (ctx->illegal_callback).data;
    pcVar2 = "sig != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar2,pvVar1);
  return 0;
}

Assistant:

int secp256k1_whitelist_signature_serialize(const secp256k1_context* ctx, unsigned char *output, size_t *output_len, const secp256k1_whitelist_signature *sig) {
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(output_len != NULL);
    ARG_CHECK(sig != NULL);

    if (*output_len < 1 + 32 * (sig->n_keys + 1)) {
        return 0;
    }

    output[0] = sig->n_keys;
    memcpy(&output[1], &sig->data[0], 32 * (sig->n_keys + 1));
    *output_len = 1 + 32 * (sig->n_keys + 1);

    return 1;
}